

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ReturnStmt *stmt)

{
  char cVar1;
  uint32_t uVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  element_type *var;
  undefined1 local_58 [16];
  string local_48;
  string_view local_28;
  undefined8 local_18;
  ReturnStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = stmt;
  stmt_local = (ReturnStmt *)this;
  if ((this->generator_->debug & 1U) != 0) {
    uVar2 = Stream::line_no(&this->stream_);
    *(uint32_t *)(local_18 + 0x20) = uVar2;
  }
  local_28 = indent(this);
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_28);
  poVar4 = std::operator<<(pbVar3,"return ");
  ReturnStmt::value((ReturnStmt *)local_58);
  var = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  Stream::var_str_abi_cxx11_((string *)(local_58 + 0x10),&this->stream_,var);
  poVar4 = std::operator<<(poVar4,(string *)(local_58 + 0x10));
  poVar4 = std::operator<<(poVar4,";");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar4,cVar1);
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_58);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ReturnStmt* stmt) {
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << "return " << stream_.var_str(stmt->value().get()) << ";"
            << stream_.endl();
}